

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtree.c
# Opt level: O1

GTree * g_tree_new(GCompareFunc key_compare_func)

{
  GTree *pGVar1;
  
  pGVar1 = (GTree *)g_slice_alloc(0x30);
  pGVar1->root = (GTreeNode *)0x0;
  pGVar1->key_compare = (GCompareDataFunc)key_compare_func;
  pGVar1->key_destroy_func = (GDestroyNotify)0x0;
  pGVar1->value_destroy_func = (GDestroyNotify)0x0;
  *(undefined8 *)((long)&pGVar1->value_destroy_func + 4) = 0;
  *(undefined8 *)((long)&pGVar1->key_compare_data + 4) = 0;
  pGVar1->ref_count = 1;
  return pGVar1;
}

Assistant:

GTree *g_tree_new (GCompareFunc key_compare_func)
{
    g_return_val_if_fail (key_compare_func != NULL, NULL);

    return g_tree_new_full ((GCompareDataFunc) key_compare_func, NULL,
            NULL, NULL);
}